

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O1

void __thiscall effolkronium::seeder_default::seeder_default(seeder_default *this)

{
  uint uVar1;
  initializer_list<unsigned_long> __il;
  ulong local_13a8;
  undefined8 local_13a0;
  random_device local_1398;
  
  std::random_device::random_device(&local_1398);
  uVar1 = std::random_device::_M_getval();
  local_13a8 = (ulong)uVar1;
  local_13a0 = std::chrono::_V2::steady_clock::now();
  __il._M_len = 2;
  __il._M_array = &local_13a8;
  std::seed_seq::seed_seq<unsigned_long,void>(&this->seed_seq,__il);
  std::random_device::_M_fini();
  return;
}

Assistant:

std::seed_seq& operator() ( ) {
            // MinGW issue, std::random_device returns constant value
            // Use std::seed_seq with additional seed from C++ chrono
            return seed_seq;
        }